

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PltFileManager.cpp
# Opt level: O2

void __thiscall
pele::physics::pltfilemanager::PltFileManager::readLevelBoxArray
          (PltFileManager *this,int a_lev,BoxArray *a_grid)

{
  Vector<char,_std::allocator<char>_> fileCharPtr;
  string fileCharPtrString;
  string line;
  string lvlHeader;
  istringstream is;
  
  std::operator+(&line,&this->m_pltFile,"/");
  std::operator+(&fileCharPtrString,&line,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::level_prefix_abi_cxx11_);
  std::__cxx11::to_string((string *)&fileCharPtr,a_lev);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&is,
                 &fileCharPtrString,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fileCharPtr);
  std::operator+(&lvlHeader,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&is
                 ,"/Cell_H");
  std::__cxx11::string::~string((string *)&is);
  std::__cxx11::string::~string((string *)&fileCharPtr);
  std::__cxx11::string::~string((string *)&fileCharPtrString);
  std::__cxx11::string::~string((string *)&line);
  fileCharPtr.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  fileCharPtr.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  fileCharPtr.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  _is = amrex::ParallelDescriptor::m_comm;
  amrex::ParallelDescriptor::ReadAndBcastFile(&lvlHeader,&fileCharPtr,true,(MPI_Comm *)&is);
  std::__cxx11::string::string
            ((string *)&fileCharPtrString,
             fileCharPtr.super_vector<char,_std::allocator<char>_>.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(allocator *)&is);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)&is,(string *)&fileCharPtrString,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&line);
  GotoNextLine((istream *)&is);
  GotoNextLine((istream *)&is);
  GotoNextLine((istream *)&is);
  amrex::BoxArray::readFrom(a_grid,(istream *)&is);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::~string((string *)&fileCharPtrString);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&fileCharPtr);
  std::__cxx11::string::~string((string *)&lvlHeader);
  return;
}

Assistant:

void
PltFileManager::readLevelBoxArray(int a_lev, BoxArray& a_grid)
{
  const std::string lvlHeader(
    m_pltFile + "/" + level_prefix + std::to_string(a_lev) + "/Cell_H");

  Vector<char> fileCharPtr;
  ParallelDescriptor::ReadAndBcastFile(lvlHeader, fileCharPtr);
  std::string fileCharPtrString(fileCharPtr.dataPtr());
  std::istringstream is(fileCharPtrString, std::istringstream::in);

  std::string line;

  std::getline(is, line); // Skip
  GotoNextLine(is);       // Skip
  GotoNextLine(is);       // Skip
  GotoNextLine(is);       // Skip
  a_grid.readFrom(is);
}